

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

int * __thiscall google::protobuf::RepeatedField<int>::Get(RepeatedField<int> *this,int index)

{
  int *piVar1;
  int in_ESI;
  RepeatedField<int> *in_stack_ffffffffffffffa0;
  
  piVar1 = elements(in_stack_ffffffffffffffa0);
  return piVar1 + in_ESI;
}

Assistant:

inline const Element& RepeatedField<Element>::Get(int index) const {
  GOOGLE_DCHECK_GE(index, 0);
  GOOGLE_DCHECK_LT(index, current_size_);
  return elements()[index];
}